

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
ocl::KernelSource::execSubdivided
          (KernelSource *this,WorkSize *ws,Arg *arg0,Arg *arg1,Arg *arg2,Arg *arg3,Arg *arg4,
          Arg *arg5,Arg *arg6,Arg *arg7,Arg *arg8,Arg *arg9,Arg *arg10,Arg *arg11,Arg *arg12,
          Arg *arg13,Arg *arg14,Arg *arg15,Arg *arg16,Arg *arg17,Arg *arg18,Arg *arg19,Arg *arg20,
          Arg *arg21,Arg *arg22,Arg *arg23,Arg *arg24,Arg *arg25,Arg *arg26,Arg *arg27,Arg *arg28,
          Arg *arg29,Arg *arg30,Arg *arg31,Arg *arg32,Arg *arg33,Arg *arg34,Arg *arg35,Arg *arg36,
          Arg *arg37,Arg *arg38,Arg *arg39,Arg *arg40)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> kernel_00;
  size_t sVar1;
  uint uVar2;
  size_t *psVar3;
  OpenCLKernel *this_00;
  unsigned_long *puVar4;
  element_type *this_01;
  size_t *psVar5;
  undefined1 local_1b0 [24];
  WorkSize ws_part;
  uint local_160;
  size_t current_z;
  unsigned_long local_150;
  size_t current_y;
  unsigned_long local_140;
  size_t current_x;
  size_t offset [3];
  size_t offset_z;
  size_t offset_y;
  size_t offset_x;
  Context local_f8;
  OpenCLKernel *kernel;
  Context context;
  size_t part_z;
  size_t part_y;
  size_t part_x;
  size_t nparts_z;
  size_t nparts_y;
  size_t nparts_x;
  size_t total_z;
  size_t total_y;
  size_t total_x;
  size_t local_z;
  size_t local_y;
  size_t local_x;
  size_t max_total_size;
  Arg *arg3_local;
  Arg *arg2_local;
  Arg *arg1_local;
  Arg *arg0_local;
  WorkSize *ws_local;
  KernelSource *this_local;
  
  local_x = 1000000;
  max_total_size = (size_t)arg3;
  arg3_local = arg2;
  arg2_local = arg1;
  arg1_local = arg0;
  arg0_local = (Arg *)ws;
  ws_local = (WorkSize *)this;
  psVar3 = gpu::WorkSize::clLocalSize(ws);
  local_y = *psVar3;
  psVar3 = gpu::WorkSize::clLocalSize((WorkSize *)arg0_local);
  local_z = psVar3[1];
  psVar3 = gpu::WorkSize::clLocalSize((WorkSize *)arg0_local);
  total_x = psVar3[2];
  psVar3 = gpu::WorkSize::clGlobalSize((WorkSize *)arg0_local);
  total_y = *psVar3;
  psVar3 = gpu::WorkSize::clGlobalSize((WorkSize *)arg0_local);
  total_z = psVar3[1];
  psVar3 = gpu::WorkSize::clGlobalSize((WorkSize *)arg0_local);
  context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar3[2];
  nparts_y = 1;
  nparts_z = 1;
  part_x = 1;
  part_z = total_z;
  part_y = total_y;
  nparts_x = (size_t)context.data_ref_.
                     super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
  while (sVar1 = local_y,
        1000000 < part_y * part_z *
                  (long)context.data_ref_.
                        super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi && local_y < part_y) {
    nparts_y = nparts_y << 1;
    uVar2 = gpu::divup((uint)total_y,(uint)nparts_y);
    uVar2 = gpu::divup(uVar2,(uint)local_y);
    part_y = sVar1 * uVar2;
  }
  while (sVar1 = local_z,
        1000000 < part_y * part_z *
                  (long)context.data_ref_.
                        super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi && local_z < part_z) {
    nparts_z = nparts_z << 1;
    uVar2 = gpu::divup((uint)total_z,(uint)nparts_z);
    uVar2 = gpu::divup(uVar2,(uint)local_z);
    part_z = sVar1 * uVar2;
  }
  while (sVar1 = total_x,
        1000000 < part_y * part_z *
                  (long)context.data_ref_.
                        super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi &&
        total_x < context.data_ref_.
                  super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi) {
    part_x = part_x << 1;
    uVar2 = gpu::divup((uint)nparts_x,(uint)part_x);
    uVar2 = gpu::divup(uVar2,(uint)total_x);
    context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar1 * uVar2);
  }
  gpu::Context::Context((Context *)&kernel);
  gpu::Context::cl(&local_f8);
  this_00 = getKernel(this,(shared_ptr<ocl::OpenCLEngine> *)&local_f8,false);
  std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_f8);
  local_f8.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  OpenCLKernel::setArgs
            (this_00,arg1_local,arg2_local,arg3_local,(Arg *)max_total_size,arg4,arg5,arg6,arg7,arg8
             ,arg9,arg10,arg11,arg12,arg13,arg14,arg15,arg16,arg17,arg18,arg19,arg20,arg21,arg22,
             arg23,arg24,arg25,arg26,arg27,arg28,arg29,arg30,arg31,arg32,arg33,arg34,arg35,arg36,
             arg37,arg38,arg39,arg40);
  for (offset_y = 0; offset_y < total_y; offset_y = part_y + offset_y) {
    for (offset_z = 0; offset_z < total_z; offset_z = part_z + offset_z) {
      for (offset[2] = 0; offset[2] < nparts_x;
          offset[2] = (long)&(context.data_ref_.
                              super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + offset[2]) {
        current_x = offset_y;
        offset[0] = offset_z;
        offset[1] = offset[2];
        current_y = total_y - offset_y;
        puVar4 = std::min<unsigned_long>(&part_y,&current_y);
        local_140 = *puVar4;
        current_z = total_z - offset_z;
        puVar4 = std::min<unsigned_long>(&part_z,&current_z);
        local_150 = *puVar4;
        ws_part._48_8_ = nparts_x - offset[2];
        puVar4 = std::min<unsigned_long>
                           ((unsigned_long *)
                            &context.data_ref_.
                             super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(unsigned_long *)&ws_part.workDims);
        local_160 = (uint)*puVar4;
        gpu::WorkSize::WorkSize
                  ((WorkSize *)(local_1b0 + 0x10),(uint)local_y,(uint)local_z,(uint)total_x,
                   (uint)local_140,(uint)local_150,local_160);
        gpu::Context::cl((Context *)local_1b0);
        this_01 = std::
                  __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_1b0);
        kernel_00._M_pi =
             local_f8.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        psVar3 = gpu::WorkSize::clGlobalSize((WorkSize *)(local_1b0 + 0x10));
        psVar5 = gpu::WorkSize::clLocalSize((WorkSize *)(local_1b0 + 0x10));
        OpenCLEngine::ndRangeKernel
                  (this_01,(OpenCLKernel *)kernel_00._M_pi,3,&current_x,psVar3,psVar5);
        std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)local_1b0);
      }
    }
  }
  gpu::Context::~Context((Context *)&kernel);
  return;
}

Assistant:

void KernelSource::execSubdivided(const gpu::WorkSize &ws, const Arg &arg0, const Arg &arg1, const Arg &arg2, const Arg &arg3, const Arg &arg4, const Arg &arg5, const Arg &arg6, const Arg &arg7, const Arg &arg8, const Arg &arg9, const Arg &arg10, const Arg &arg11, const Arg &arg12, const Arg &arg13, const Arg &arg14, const Arg &arg15, const Arg &arg16, const Arg &arg17, const Arg &arg18, const Arg &arg19, const Arg &arg20, const Arg &arg21, const Arg &arg22, const Arg &arg23, const Arg &arg24, const Arg &arg25, const Arg &arg26, const Arg &arg27, const Arg &arg28, const Arg &arg29, const Arg &arg30, const Arg &arg31, const Arg &arg32, const Arg &arg33, const Arg &arg34, const Arg &arg35, const Arg &arg36, const Arg &arg37, const Arg &arg38, const Arg &arg39, const Arg &arg40)
{
	const size_t max_total_size = 1000000;

	const size_t local_x = ws.clLocalSize()[0];
	const size_t local_y = ws.clLocalSize()[1];
	const size_t local_z = ws.clLocalSize()[2];

	const size_t total_x = ws.clGlobalSize()[0];
	const size_t total_y = ws.clGlobalSize()[1];
	const size_t total_z = ws.clGlobalSize()[2];

	size_t nparts_x = 1;
	size_t nparts_y = 1;
	size_t nparts_z = 1;

	size_t part_x = total_x;
	size_t part_y = total_y;
	size_t part_z = total_z;

	while (part_x * part_y * part_z > max_total_size && part_x > local_x) {
		nparts_x *= 2;
		part_x = local_x * gpu::divup(gpu::divup(total_x, nparts_x), local_x);
	}
	while (part_x * part_y * part_z > max_total_size && part_y > local_y) {
		nparts_y *= 2;
		part_y = local_y * gpu::divup(gpu::divup(total_y, nparts_y), local_y);
	}
	while (part_x * part_y * part_z > max_total_size && part_z > local_z) {
		nparts_z *= 2;
		part_z = local_z * gpu::divup(gpu::divup(total_z, nparts_z), local_z);
	}

	gpu::Context context;

	OpenCLKernel *kernel = getKernel(context.cl());

	kernel->setArgs(arg0, arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16, arg17, arg18, arg19, arg20, arg21, arg22, arg23, arg24, arg25, arg26, arg27, arg28, arg29, arg30, arg31, arg32, arg33, arg34, arg35, arg36, arg37, arg38, arg39, arg40);

	for (size_t offset_x = 0; offset_x < total_x; offset_x += part_x) {
		for (size_t offset_y = 0; offset_y < total_y; offset_y += part_y) {
			for (size_t offset_z = 0; offset_z < total_z; offset_z += part_z) {
				size_t offset[3];
				offset[0] = offset_x;
				offset[1] = offset_y;
				offset[2] = offset_z;

				size_t current_x = std::min(part_x, total_x - offset_x);
				size_t current_y = std::min(part_y, total_y - offset_y);
				size_t current_z = std::min(part_z, total_z - offset_z);

				gpu::WorkSize ws_part(local_x, local_y, local_z, current_x, current_y, current_z);

				// NOTTODO: generalize this logic, apply it to CUDA, make so that ndRangeKernel is called only in one place in codebase, remove all get_group_id/get_num_groups calls, etc.
				context.cl()->ndRangeKernel(*kernel, 3, offset, ws_part.clGlobalSize(), ws_part.clLocalSize());
			}
		}
	}
}